

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

int bcatblk(bstring b,void *s,int len)

{
  int iVar1;
  int iVar2;
  int nl;
  int len_local;
  void *s_local;
  bstring b_local;
  
  if (((((b == (bstring)0x0) || (b->data == (uchar *)0x0)) || (b->slen < 0)) ||
      ((b->mlen < b->slen || (b->mlen < 1)))) || ((s == (void *)0x0 || (len < 0)))) {
    b_local._4_4_ = -1;
  }
  else {
    iVar2 = b->slen + len;
    if (iVar2 < 0) {
      b_local._4_4_ = -1;
    }
    else {
      if ((b->mlen <= iVar2) && (iVar1 = balloc(b,iVar2 + 1), iVar1 < 0)) {
        return -1;
      }
      if (len != 0) {
        memmove(b->data + b->slen,s,(long)len);
      }
      b->slen = iVar2;
      b->data[iVar2] = '\0';
      b_local._4_4_ = 0;
    }
  }
  return b_local._4_4_;
}

Assistant:

int bcatblk (bstring b, const void * s, int len) {
int nl;

	if (b == NULL || b->data == NULL || b->slen < 0 || b->mlen < b->slen
	 || b->mlen <= 0 || s == NULL || len < 0) return BSTR_ERR;

	if (0 > (nl = b->slen + len)) return BSTR_ERR; /* Overflow? */
	if (b->mlen <= nl && 0 > balloc (b, nl + 1)) return BSTR_ERR;

	bBlockCopy (&b->data[b->slen], s, (size_t) len);
	b->slen = nl;
	b->data[nl] = (unsigned char) '\0';
	return BSTR_OK;
}